

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::buildNullables(Automaton *this)

{
  _List_iterator<std::_List_iterator<QString>_> __first;
  bool bVar1;
  Automaton *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  pair<std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>,_bool> pVar3;
  bool changed;
  iterator nn;
  RulePointer rule;
  NameSet *in_stack_ffffffffffffff80;
  NotNullable __pred;
  _Rb_tree_const_iterator<std::_List_iterator<QString>_> in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  _Self local_40;
  NotNullable local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  __pred._M_automaton = in_RDI;
  while (bVar2) {
    bVar2 = false;
    local_20._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Rule,_std::allocator<Rule>_>::begin
                   ((list<Rule,_std::allocator<Rule>_> *)in_stack_ffffffffffffff80);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<Rule,_std::allocator<Rule>_>::end
                     ((list<Rule,_std::allocator<Rule>_> *)in_stack_ffffffffffffff80);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      local_30._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
      std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11f6fc);
      std::__cxx11::
      list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::begin
                ((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                  *)in_stack_ffffffffffffff80);
      std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11f717);
      std::__cxx11::
      list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::end
                ((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                  *)in_stack_ffffffffffffff80);
      NotNullable::NotNullable(&local_38,in_RDI);
      __first._M_node._1_7_ = in_stack_ffffffffffffffb9;
      __first._M_node._0_1_ = in_stack_ffffffffffffffb8;
      local_30._M_node =
           (_List_node_base *)
           std::find_if<std::_List_iterator<std::_List_iterator<QString>>,NotNullable>
                     (__first,(_List_iterator<std::_List_iterator<QString>_>)
                              in_stack_ffffffffffffffb0._M_node,__pred);
      std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11f75a);
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::end
                     ((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                       *)in_stack_ffffffffffffff80);
      bVar1 = std::operator==(&local_30,&local_40);
      if (bVar1) {
        in_stack_ffffffffffffff80 = &in_RDI->nullables;
        std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11f798);
        pVar3 = std::
                set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                ::insert((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                          *)in_RDI,(value_type *)in_stack_ffffffffffffff80);
        in_stack_ffffffffffffffb0 = pVar3.first._M_node;
        in_stack_ffffffffffffffb8 = pVar3.second;
        bVar2 = bVar2 || ((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
        local_18 = in_stack_ffffffffffffffb0._M_node;
        local_10 = in_stack_ffffffffffffffb8;
      }
      std::_List_iterator<Rule>::operator++(&local_20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildNullables ()
{
  bool changed = true;

  while (changed)
    {
      changed = false;

      for (RulePointer rule = _M_grammar->rules.begin (); rule != _M_grammar->rules.end (); ++rule)
        {
          NameList::iterator nn = std::find_if(rule->rhs.begin(), rule->rhs.end(), NotNullable(this));

          if (nn == rule->rhs.end ())
            changed |= nullables.insert (rule->lhs).second;
        }
    }

#ifndef QLALR_NO_DEBUG_NULLABLES
  qerr() << "nullables = {" << nullables << Qt::endl;
#endif
}